

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_pixel_ops.cpp
# Opt level: O3

bool dxil_spv::emit_sample_index_instruction(Impl *impl,CallInst *instruction)

{
  Id arg;
  Operation *this;
  Builder *pBVar1;
  Capability local_1c;
  
  arg = SPIRVModule::get_builtin_shader_input(impl->spirv_module,BuiltInSampleId);
  this = Converter::Impl::allocate(impl,OpLoad,(Value *)instruction);
  Operation::add_id(this,arg);
  Converter::Impl::add(impl,this,false);
  pBVar1 = Converter::Impl::builder(impl);
  local_1c = CapabilitySampleRateShading;
  std::
  _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
  ::_M_insert_unique<spv::Capability_const&>
            ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
              *)&pBVar1->capabilities,&local_1c);
  return true;
}

Assistant:

bool emit_sample_index_instruction(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	spv::Id var_id = impl.spirv_module.get_builtin_shader_input(spv::BuiltInSampleId);
	Operation *op = impl.allocate(spv::OpLoad, instruction);
	op->add_id(var_id);
	impl.add(op);
	impl.builder().addCapability(spv::CapabilitySampleRateShading);
	return true;
}